

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DArray.hpp
# Opt level: O0

void __thiscall Lib::DArray<int>::~DArray(DArray<int> *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x10) != 0) {
    array_delete<int>(*(int **)(in_RDI + 0x10),*(size_t *)(in_RDI + 8));
    Lib::free(*(void **)(in_RDI + 0x10));
  }
  return;
}

Assistant:

inline ~DArray()
  {
    if(_array) {
      array_delete(_array, _capacity);
      DEALLOC_KNOWN(_array,sizeof(C)*_capacity,"DArray<>");
    }
  }